

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerResults.cpp
# Opt level: O2

void __thiscall
AsyncRgbLedAnalyzerResults::GenerateFrameTabularText
          (AsyncRgbLedAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char greenString [8];
  char redString [8];
  RGBValue rgb;
  Frame frame;
  U64 local_88;
  char blueString [8];
  char buf [64];
  
  AnalyzerResults::GetFrame((ulonglong)&frame);
  AnalyzerResults::ClearTabularText();
  rgb = RGBValue::CreateFromU64(local_88);
  GenerateRGBStrings(this,&rgb,display_base,8,redString,greenString,blueString);
  snprintf(buf,0x40,"[%d] %s, %s, %s");
  AnalyzerResults::AddTabularText((char *)this,buf,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame(&frame);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
#ifdef SUPPORTS_PROTOCOL_SEARCH
    Frame frame = GetFrame( frame_index );
    ClearTabularText();

    const U32 ledIndex = frame.mData2;
    const RGBValue rgb = RGBValue::CreateFromU64( frame.mData1 );

    const int colorNumericBufferLength = 8;
    char redString[ colorNumericBufferLength ], greenString[ colorNumericBufferLength ], blueString[ colorNumericBufferLength ];

    GenerateRGBStrings( rgb, display_base, colorNumericBufferLength, redString, greenString, blueString );

    // target content: [13] 0x1A, 0x2B, 0x3C
    char buf[ 64 ];
    ::snprintf( buf, 64, "[%d] %s, %s, %s", ledIndex, redString, greenString, blueString );
    AddTabularText( buf );
#endif
}